

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
                   idx_t idx)

{
  anon_union_16_2_67f50693_for_value aVar1;
  anon_class_8_1_6971b95b *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  undefined1 in_stack_000000b8 [16];
  
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       ParseDirpathFunction::anon_class_8_1_6971b95b::operator()
                 (in_stack_000000a0,(string_t)in_stack_000000b8,(string_t)in_stack_000000a8);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}